

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalPivot::Deserialize(LogicalPivot *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  _Head_base<0UL,_duckdb::LogicalPivot_*,_false> this_00;
  pointer pLVar3;
  undefined4 extraout_var;
  pointer *__ptr;
  unique_ptr<duckdb::LogicalPivot,_std::default_delete<duckdb::LogicalPivot>,_true> result;
  _Tuple_impl<0UL,_duckdb::LogicalPivot_*,_std::default_delete<duckdb::LogicalPivot>_> local_28;
  idx_t iVar4;
  
  this_00._M_head_impl = (LogicalPivot *)operator_new(0xc0);
  LogicalPivot(this_00._M_head_impl);
  local_28.super__Head_base<0UL,_duckdb::LogicalPivot_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::LogicalPivot_*,_false>)
       (_Head_base<0UL,_duckdb::LogicalPivot_*,_false>)this_00._M_head_impl;
  pLVar3 = unique_ptr<duckdb::LogicalPivot,_std::default_delete<duckdb::LogicalPivot>,_true>::
           operator->((unique_ptr<duckdb::LogicalPivot,_std::default_delete<duckdb::LogicalPivot>,_true>
                       *)&local_28);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"pivot_index");
  if ((char)uVar1 == '\0') {
    iVar4 = 0;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar4 = CONCAT44(extraout_var,iVar2);
  }
  pLVar3->pivot_index = iVar4;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  pLVar3 = unique_ptr<duckdb::LogicalPivot,_std::default_delete<duckdb::LogicalPivot>,_true>::
           operator->((unique_ptr<duckdb::LogicalPivot,_std::default_delete<duckdb::LogicalPivot>,_true>
                       *)&local_28);
  Deserializer::ReadProperty<duckdb::BoundPivotInfo>
            (deserializer,0xc9,"bound_pivot",&pLVar3->bound_pivot);
  (this->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)local_28.super__Head_base<0UL,_duckdb::LogicalPivot_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalPivot::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<LogicalPivot>(new LogicalPivot());
	deserializer.ReadPropertyWithDefault<idx_t>(200, "pivot_index", result->pivot_index);
	deserializer.ReadProperty<BoundPivotInfo>(201, "bound_pivot", result->bound_pivot);
	return std::move(result);
}